

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int openDirectory(char *zFilename,int *pFd)

{
  sxu32 sVar1;
  int __fd;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char zDirname [513];
  char acStack_228 [528];
  
  sVar1 = Systrcpy(acStack_228,0x201,zFilename,0);
  if (sVar1 < 2) {
    uVar3 = 1;
    if (sVar1 == 0) {
      iVar4 = -2;
      __fd = -1;
      goto LAB_0010f5fc;
    }
  }
  else {
    do {
      uVar3 = (ulong)sVar1;
      if (acStack_228[uVar3] == '/') goto LAB_0010f5a8;
      sVar1 = sVar1 - 1;
    } while (1 < sVar1);
    uVar3 = 1;
  }
LAB_0010f5a8:
  acStack_228[uVar3] = '\0';
  iVar4 = 0;
  __fd = open(acStack_228,0,0);
  if (__fd < 0) {
    iVar4 = -2;
  }
  else {
    uVar2 = fcntl(__fd,1,0);
    fcntl(__fd,2,(ulong)(uVar2 | 1));
  }
LAB_0010f5fc:
  *pFd = __fd;
  return iVar4;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  sxu32 ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];
  sxu32 n;
  n = Systrcpy(zDirname,sizeof(zDirname),zFilename,0);
  for(ii=n; ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
#ifdef FD_CLOEXEC
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
    }
  }
  *pFd = fd;
  return (fd>=0?UNQLITE_OK: UNQLITE_IOERR );
}